

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O3

void deflate(nghttp2_hd_deflater *deflater,nghttp2_hd_inflater *inflater,nghttp2_nv *nva,
            size_t nvlen)

{
  size_t *psVar1;
  size_t __size;
  void *__ptr;
  llhttp__internal_t *state;
  size_t sVar2;
  void *extraout_RDX;
  long lVar3;
  llhttp__internal_t *plVar4;
  void *pvVar5;
  double dVar6;
  undefined1 auVar7 [16];
  nghttp2_nv nv;
  uint local_74;
  nghttp2_hd_inflater *local_70;
  nghttp2_hd_deflater *local_68;
  nghttp2_nv *local_60;
  void *local_58;
  void *local_50;
  size_t local_48;
  size_t local_40;
  
  local_70 = inflater;
  if (nvlen == 0) {
    lVar3 = 0;
    printf("Input (%zu byte(s)):\n\n",0);
  }
  else {
    psVar1 = &nva->valuelen;
    lVar3 = 0;
    sVar2 = nvlen;
    do {
      lVar3 = lVar3 + psVar1[-1] + *psVar1;
      psVar1 = psVar1 + 5;
      sVar2 = sVar2 - 1;
    } while (sVar2 != 0);
    local_68 = deflater;
    printf("Input (%zu byte(s)):\n\n",lVar3);
    psVar1 = &nva->valuelen;
    sVar2 = nvlen;
    local_60 = nva;
    do {
      fwrite(((nghttp2_nv *)(psVar1 + -3))->name,1,psVar1[-1],_stdout);
      printf(": ");
      fwrite((uint8_t *)psVar1[-2],1,*psVar1,_stdout);
      putchar(10);
      psVar1 = psVar1 + 5;
      sVar2 = sVar2 - 1;
      deflater = local_68;
      nva = local_60;
    } while (sVar2 != 0);
  }
  __size = nghttp2_hd_deflate_bound(deflater,nva,nvlen);
  __ptr = malloc(__size);
  state = (llhttp__internal_t *)nghttp2_hd_deflate_hd2(deflater,__ptr,__size,nva,nvlen);
  if ((long)state < 0) {
    deflate_cold_1();
    llhttp__internal_init(state);
    state->type = (uint8_t)__ptr;
    state->settings = extraout_RDX;
    return;
  }
  dVar6 = 0.0;
  if (lVar3 != 0) {
    auVar7._8_4_ = (int)((ulong)lVar3 >> 0x20);
    auVar7._0_8_ = lVar3;
    auVar7._12_4_ = 0x45300000;
    dVar6 = (double)(long)state /
            ((auVar7._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0));
  }
  printf("\nDeflate (%zu byte(s), ratio %.02f):\n\n",dVar6,state);
  if (state != (llhttp__internal_t *)0x0) {
    plVar4 = (llhttp__internal_t *)0x0;
    do {
      if (((ulong)plVar4 & 0xf) == 0) {
        printf("%08zX: ",plVar4);
      }
      printf("%02X ",(ulong)*(byte *)((long)__ptr + (long)plVar4));
      plVar4 = (llhttp__internal_t *)((long)&plVar4->_index + 1);
      if (((ulong)plVar4 & 0xf) == 0) {
        putchar(10);
      }
    } while (state != plVar4);
  }
  puts("\n\nInflate:\n");
  local_74 = 0;
  lVar3 = nghttp2_hd_inflate_hd3(local_70,&local_58,&local_74,__ptr,state,1);
  if (-1 < lVar3) {
    pvVar5 = __ptr;
    do {
      if ((local_74 & 2) != 0) {
        fwrite(local_58,1,local_48,_stderr);
        fwrite(": ",2,1,_stderr);
        fwrite(local_50,1,local_40,_stderr);
        fputc(10,_stderr);
      }
      if ((local_74 & 1) != 0) {
        nghttp2_hd_inflate_end_headers(local_70);
LAB_001016b0:
        puts("\n-------------------------------------------------------------------------------");
        free(__ptr);
        return;
      }
      state = (llhttp__internal_t *)((long)state - lVar3);
      if (state == (llhttp__internal_t *)0x0 && (local_74 & 2) == 0) goto LAB_001016b0;
      pvVar5 = (void *)((long)pvVar5 + lVar3);
      local_74 = 0;
      lVar3 = nghttp2_hd_inflate_hd3(local_70,&local_58,&local_74,pvVar5,state,1);
    } while (-1 < lVar3);
  }
  fprintf(_stderr,"inflate failed with error code %td",lVar3);
  free(__ptr);
  exit(1);
}

Assistant:

static void deflate(nghttp2_hd_deflater *deflater,
                    nghttp2_hd_inflater *inflater, const nghttp2_nv *const nva,
                    size_t nvlen) {
  nghttp2_ssize rv;
  uint8_t *buf;
  size_t buflen;
  size_t outlen;
  size_t i;
  size_t sum;

  sum = 0;

  for (i = 0; i < nvlen; ++i) {
    sum += nva[i].namelen + nva[i].valuelen;
  }

  printf("Input (%zu byte(s)):\n\n", sum);

  for (i = 0; i < nvlen; ++i) {
    fwrite(nva[i].name, 1, nva[i].namelen, stdout);
    printf(": ");
    fwrite(nva[i].value, 1, nva[i].valuelen, stdout);
    printf("\n");
  }

  buflen = nghttp2_hd_deflate_bound(deflater, nva, nvlen);
  buf = malloc(buflen);

  rv = nghttp2_hd_deflate_hd2(deflater, buf, buflen, nva, nvlen);

  if (rv < 0) {
    fprintf(stderr, "nghttp2_hd_deflate_hd2() failed with error: %s\n",
            nghttp2_strerror((int)rv));

    free(buf);

    exit(EXIT_FAILURE);
  }

  outlen = (size_t)rv;

  printf("\nDeflate (%zu byte(s), ratio %.02f):\n\n", outlen,
         sum == 0 ? 0 : (double)outlen / (double)sum);

  for (i = 0; i < outlen; ++i) {
    if ((i & 0x0fu) == 0) {
      printf("%08zX: ", i);
    }

    printf("%02X ", buf[i]);

    if (((i + 1) & 0x0fu) == 0) {
      printf("\n");
    }
  }

  printf("\n\nInflate:\n\n");

  /* We pass 1 to final parameter, because buf contains whole deflated
     header data. */
  rv = inflate_header_block(inflater, buf, outlen, 1);

  if (rv != 0) {
    free(buf);

    exit(EXIT_FAILURE);
  }

  printf("\n-----------------------------------------------------------"
         "--------------------\n");

  free(buf);
}